

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O2

hugeint_t duckdb::UUID::GenerateRandomUUID(RandomEngine *engine)

{
  uint32_t uVar1;
  int i;
  ulong uVar2;
  hugeint_t hVar3;
  array<unsigned_char,_16UL> bytes;
  array<unsigned_char,_16UL> local_20;
  
  for (uVar2 = 0; uVar2 < 0x10; uVar2 = uVar2 + 4) {
    uVar1 = RandomEngine::NextRandomInteger(engine);
    *(uint32_t *)(local_20._M_elems + uVar2) = uVar1;
  }
  local_20._M_elems[8] = local_20._M_elems[8] & 0x3f | 0x80;
  local_20._M_elems[6] = local_20._M_elems[6] & 0xf | 0x40;
  hVar3 = BaseUUID::Convert(&local_20);
  return hVar3;
}

Assistant:

hugeint_t UUIDv4::GenerateRandomUUID(RandomEngine &engine) {
	std::array<uint8_t, 16> bytes;
	for (int i = 0; i < 16; i += 4) {
		*reinterpret_cast<uint32_t *>(bytes.data() + i) = engine.NextRandomInteger();
	}
	// variant must be 10xxxxxx
	bytes[8] &= 0xBF;
	bytes[8] |= 0x80;
	// version must be 0100xxxx
	bytes[6] &= 0x4F;
	bytes[6] |= 0x40;

	return Convert(bytes);
}